

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O2

void printThumbAddrModeImm5SOperand(MCInst *MI,uint Op,SStream *O,uint Scale)

{
  cs_struct *h;
  cs_detail *pcVar1;
  char *pcVar2;
  _Bool _Var3;
  uint uVar4;
  MCOperand *op;
  MCOperand *op_00;
  int64_t iVar5;
  undefined4 in_register_00000034;
  SStream *O_00;
  
  O_00 = (SStream *)CONCAT44(in_register_00000034,Op);
  op = MCInst_getOperand(MI,1);
  op_00 = MCInst_getOperand(MI,2);
  _Var3 = MCOperand_isReg(op);
  if (_Var3) {
    SStream_concat0(O_00,"[");
    set_mem_access(MI,true);
    h = MI->csh;
    uVar4 = MCOperand_getReg(op);
    printRegName(h,O_00,uVar4);
    if (MI->csh->detail != CS_OPT_OFF) {
      uVar4 = MCOperand_getReg(op);
      pcVar1 = MI->flat_insn->detail;
      *(uint *)(pcVar1->groups + (ulong)(pcVar1->field_6).arm.op_count * 0x28 + 0x46) = uVar4;
    }
    iVar5 = MCOperand_getImm(op_00);
    if ((int)iVar5 != 0) {
      uVar4 = (int)iVar5 * (int)O;
      SStream_concat0(O_00,", ");
      pcVar2 = ", #%u";
      if (9 < uVar4) {
        pcVar2 = ", #0x%x";
      }
      SStream_concat(O_00,pcVar2 + 2,(ulong)uVar4);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar1 = MI->flat_insn->detail;
        *(uint *)(pcVar1->groups + (ulong)(pcVar1->field_6).arm.op_count * 0x28 + 0x52) = uVar4;
      }
    }
    SStream_concat0(O_00,"]");
    set_mem_access(MI,false);
    return;
  }
  printOperand(MI,1,O_00);
  return;
}

Assistant:

static void printThumbAddrModeImm5SOperand(MCInst *MI, unsigned Op, SStream *O,
		unsigned Scale)
{
	MCOperand *MO1 = MCInst_getOperand(MI, Op);
	MCOperand *MO2 = MCInst_getOperand(MI, Op + 1);
	unsigned ImmOffs, tmp;

	if (!MCOperand_isReg(MO1)) {   // FIXME: This is for CP entries, but isn't right.
		printOperand(MI, Op, O);
		return;
	}

	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);
	ImmOffs = (unsigned int)MCOperand_getImm(MO2);
	if (ImmOffs) {
		tmp = ImmOffs * Scale;
		SStream_concat0(O, ", ");
		if (tmp > HEX_THRESHOLD)
			SStream_concat(O, "#0x%x", tmp);
		else
			SStream_concat(O, "#%u", tmp);
		if (MI->csh->detail)
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = tmp;
	}
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}